

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O3

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::Mesh>
          (Structure *this,Mesh *dest,FileDatabase *db)

{
  ReadField<2,Assimp::Blender::ID>(this,&dest->id,"id",db);
  ReadField<2,int>(this,&dest->totface,"totface",db);
  ReadField<2,int>(this,&dest->totedge,"totedge",db);
  ReadField<2,int>(this,&dest->totvert,"totvert",db);
  ReadField<1,int>(this,&dest->totloop,"totloop",db);
  ReadField<1,int>(this,&dest->totpoly,"totpoly",db);
  ReadField<1,short>(this,&dest->subdiv,"subdiv",db);
  ReadField<1,short>(this,&dest->subdivr,"subdivr",db);
  ReadField<1,short>(this,&dest->subsurftype,"subsurftype",db);
  ReadField<1,short>(this,&dest->smoothresh,"smoothresh",db);
  ReadFieldPtr<2,Assimp::Blender::vector,Assimp::Blender::MFace>
            (this,&dest->mface,"*mface",db,false);
  ReadFieldPtr<1,Assimp::Blender::vector,Assimp::Blender::MTFace>
            (this,&dest->mtface,"*mtface",db,false);
  ReadFieldPtr<1,Assimp::Blender::vector,Assimp::Blender::TFace>
            (this,&dest->tface,"*tface",db,false);
  ReadFieldPtr<2,Assimp::Blender::vector,Assimp::Blender::MVert>
            (this,&dest->mvert,"*mvert",db,false);
  ReadFieldPtr<1,Assimp::Blender::vector,Assimp::Blender::MEdge>
            (this,&dest->medge,"*medge",db,false);
  ReadFieldPtr<1,Assimp::Blender::vector,Assimp::Blender::MLoop>
            (this,&dest->mloop,"*mloop",db,false);
  ReadFieldPtr<1,Assimp::Blender::vector,Assimp::Blender::MLoopUV>
            (this,&dest->mloopuv,"*mloopuv",db,false);
  ReadFieldPtr<1,Assimp::Blender::vector,Assimp::Blender::MLoopCol>
            (this,&dest->mloopcol,"*mloopcol",db,false);
  ReadFieldPtr<1,Assimp::Blender::vector,Assimp::Blender::MPoly>
            (this,&dest->mpoly,"*mpoly",db,false);
  ReadFieldPtr<1,Assimp::Blender::vector,Assimp::Blender::MTexPoly>
            (this,&dest->mtpoly,"*mtpoly",db,false);
  ReadFieldPtr<1,Assimp::Blender::vector,Assimp::Blender::MDeformVert>
            (this,&dest->dvert,"*dvert",db,false);
  ReadFieldPtr<1,Assimp::Blender::vector,Assimp::Blender::MCol>(this,&dest->mcol,"*mcol",db,false);
  ReadFieldPtr<2,Assimp::Blender::vector,std::shared_ptr<Assimp::Blender::Material>>
            (this,&dest->mat,"**mat",db,false);
  ReadField<1,Assimp::Blender::CustomData>(this,&dest->vdata,"vdata",db);
  ReadField<1,Assimp::Blender::CustomData>(this,&dest->edata,"edata",db);
  ReadField<1,Assimp::Blender::CustomData>(this,&dest->fdata,"fdata",db);
  ReadField<1,Assimp::Blender::CustomData>(this,&dest->pdata,"pdata",db);
  ReadField<1,Assimp::Blender::CustomData>(this,&dest->ldata,"ldata",db);
  StreamReader<true,_true>::IncPtr
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,this->size);
  return;
}

Assistant:

void Structure :: Convert<Mesh> (
    Mesh& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Fail>(dest.id,"id",db);
    ReadField<ErrorPolicy_Fail>(dest.totface,"totface",db);
    ReadField<ErrorPolicy_Fail>(dest.totedge,"totedge",db);
    ReadField<ErrorPolicy_Fail>(dest.totvert,"totvert",db);
    ReadField<ErrorPolicy_Igno>(dest.totloop,"totloop",db);
    ReadField<ErrorPolicy_Igno>(dest.totpoly,"totpoly",db);
    ReadField<ErrorPolicy_Igno>(dest.subdiv,"subdiv",db);
    ReadField<ErrorPolicy_Igno>(dest.subdivr,"subdivr",db);
    ReadField<ErrorPolicy_Igno>(dest.subsurftype,"subsurftype",db);
    ReadField<ErrorPolicy_Igno>(dest.smoothresh,"smoothresh",db);
    ReadFieldPtr<ErrorPolicy_Fail>(dest.mface,"*mface",db);
    ReadFieldPtr<ErrorPolicy_Igno>(dest.mtface,"*mtface",db);
    ReadFieldPtr<ErrorPolicy_Igno>(dest.tface,"*tface",db);
    ReadFieldPtr<ErrorPolicy_Fail>(dest.mvert,"*mvert",db);
    ReadFieldPtr<ErrorPolicy_Warn>(dest.medge,"*medge",db);
    ReadFieldPtr<ErrorPolicy_Igno>(dest.mloop,"*mloop",db);
    ReadFieldPtr<ErrorPolicy_Igno>(dest.mloopuv,"*mloopuv",db);
    ReadFieldPtr<ErrorPolicy_Igno>(dest.mloopcol,"*mloopcol",db);
    ReadFieldPtr<ErrorPolicy_Igno>(dest.mpoly,"*mpoly",db);
    ReadFieldPtr<ErrorPolicy_Igno>(dest.mtpoly,"*mtpoly",db);
    ReadFieldPtr<ErrorPolicy_Igno>(dest.dvert,"*dvert",db);
    ReadFieldPtr<ErrorPolicy_Igno>(dest.mcol,"*mcol",db);
    ReadFieldPtr<ErrorPolicy_Fail>(dest.mat,"**mat",db);

    ReadField<ErrorPolicy_Igno>(dest.vdata, "vdata", db);
    ReadField<ErrorPolicy_Igno>(dest.edata, "edata", db);
    ReadField<ErrorPolicy_Igno>(dest.fdata, "fdata", db);
    ReadField<ErrorPolicy_Igno>(dest.pdata, "pdata", db);
    ReadField<ErrorPolicy_Warn>(dest.ldata, "ldata", db);

    db.reader->IncPtr(size);
}